

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_sd_right_to_left_weighted<double,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                 (double *x,double xmean,size_t *ix_arr,size_t st,size_t end,double *sd_arr,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w,double *cumw)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  double in_XMM0_Qa;
  size_t row;
  double w_this;
  double cnt;
  size_t n;
  double mean_prev;
  double running_ssq;
  double running_mean;
  unsigned_long *in_stack_ffffffffffffff88;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *this;
  double local_60;
  double local_50;
  double local_48;
  double local_40;
  
  local_40 = 0.0;
  local_48 = 0.0;
  local_60 = 0.0;
  local_50 = *(double *)(in_RDI + *(long *)(in_RSI + in_RCX * 8) * 8) - in_XMM0_Qa;
  for (this = (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *)0x0;
      this < (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *)(in_RCX - in_RDX);
      this = (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *)((long)&(this->m_ht).super_power_of_two_growth_policy<2UL>.m_mask + 1)) {
    pdVar5 = tsl::
             robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
             ::operator[](this,in_stack_ffffffffffffff88);
    dVar1 = *pdVar5;
    local_60 = dVar1 + local_60;
    local_40 = (dVar1 * ((*(double *)(in_RDI + *(long *)(in_RSI + (in_RCX - (long)this) * 8) * 8) -
                         in_XMM0_Qa) - local_40)) / local_60 + local_40;
    local_48 = dVar1 * ((*(double *)(in_RDI + *(long *)(in_RSI + (in_RCX - (long)this) * 8) * 8) -
                        in_XMM0_Qa) - local_40) *
                       ((*(double *)(in_RDI + *(long *)(in_RSI + (in_RCX - (long)this) * 8) * 8) -
                        in_XMM0_Qa) - local_50) + local_48;
    if (this == (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *)0x0) {
      in_stack_ffffffffffffff88 = (unsigned_long *)0x0;
    }
    else {
      in_stack_ffffffffffffff88 = (unsigned_long *)SQRT(local_48 / local_60);
    }
    *(unsigned_long **)(in_R8 + ((in_RCX - in_RDX) - (long)this) * 8) = in_stack_ffffffffffffff88;
    local_50 = local_40;
  }
  pdVar5 = tsl::
           robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
           ::operator[](this,in_stack_ffffffffffffff88);
  dVar1 = *pdVar5;
  local_60 = dVar1 + local_60;
  dVar2 = *(double *)(in_RDI + *(long *)(in_RSI + in_RDX * 8) * 8);
  dVar3 = *(double *)(in_RDI + *(long *)(in_RSI + in_RDX * 8) * 8);
  dVar4 = *(double *)(in_RDI + *(long *)(in_RSI + in_RDX * 8) * 8);
  *(double *)row = local_60;
  return SQRT((dVar1 * ((dVar3 - in_XMM0_Qa) -
                       (((dVar2 - in_XMM0_Qa) - local_40) / local_60 + local_40)) *
                       ((dVar4 - in_XMM0_Qa) - local_50) + local_48) / local_60);
}

Assistant:

ldouble_safe calc_sd_right_to_left_weighted(real_t_ *restrict x, real_t_ xmean, size_t ix_arr[], size_t st, size_t end,
                                           double *restrict sd_arr, mapping &restrict w, ldouble_safe &cumw)
{
    ldouble_safe running_mean = 0;
    ldouble_safe running_ssq = 0;
    real_t_ mean_prev = x[ix_arr[end]] - xmean;
    size_t n = end - st + 1;
    ldouble_safe cnt = 0;
    double w_this;
    for (size_t row = 0; row < n-1; row++)
    {
        w_this = w[ix_arr[end-row]];
        cnt += w_this;
        running_mean   += w_this * ((x[ix_arr[end-row]] - xmean) - running_mean) / cnt;
        running_ssq    += w_this * (((x[ix_arr[end-row]] - xmean) - running_mean) * ((x[ix_arr[end-row]] - xmean) - mean_prev));
        mean_prev       =  running_mean;
        sd_arr[n-row-1] = (row == 0)? 0. : std::sqrt(running_ssq / cnt);
    }
    w_this = w[ix_arr[st]];
    cnt += w_this;
    running_mean   += ((x[ix_arr[st]] - xmean) - running_mean) / cnt;
    running_ssq    += w_this * (((x[ix_arr[st]] - xmean) - running_mean) * ((x[ix_arr[st]] - xmean) - mean_prev));
    cumw = cnt;
    return std::sqrt(running_ssq / cnt);
}